

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *
util::Split<Span<char_const>>(Span<const_char> *sp,string_view separators)

{
  long lVar1;
  char **ppcVar2;
  size_type sVar3;
  undefined8 in_RSI;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *in_RDI;
  long in_FS_OFFSET;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *ret;
  char *start;
  char *it;
  Span<const_char> *in_stack_ffffffffffffff88;
  char **__args_1;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *this;
  size_type in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar4;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  this = in_RDI;
  std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::vector
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
             in_stack_ffffffffffffff88);
  local_20 = (char **)Span<const_char>::begin(in_stack_ffffffffffffff88);
  while (__args_1 = local_20, ppcVar2 = (char **)Span<const_char>::end(in_stack_ffffffffffffff88),
        __args_1 != ppcVar2) {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT17(uVar4,in_stack_ffffffffffffffc0),(char)((ulong)in_RSI >> 0x38),
                       in_stack_ffffffffffffffb8);
    if (sVar3 != 0xffffffffffffffff) {
      std::vector<Span<char_const>,std::allocator<Span<char_const>>>::
      emplace_back<char_const*&,char_const*&>(this,(char **)in_RDI,__args_1);
    }
    local_20 = (char **)((long)local_20 + 1);
  }
  std::vector<Span<char_const>,std::allocator<Span<char_const>>>::
  emplace_back<char_const*&,char_const*&>(this,(char **)in_RDI,__args_1);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

std::vector<T> Split(const Span<const char>& sp, std::string_view separators)
{
    std::vector<T> ret;
    auto it = sp.begin();
    auto start = it;
    while (it != sp.end()) {
        if (separators.find(*it) != std::string::npos) {
            ret.emplace_back(start, it);
            start = it + 1;
        }
        ++it;
    }
    ret.emplace_back(start, it);
    return ret;
}